

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O1

int Seg_ManCountIntLevels(Seg_Man_t *p,int iStartVar)

{
  int **ppLevels;
  Vec_Int_t *pVVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  pVVar1 = p->vFirsts;
  uVar7 = p->pGia->nObjs;
  if (pVVar1->nCap < (int)uVar7) {
    if (pVVar1->pArray == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar7 << 2);
    }
    else {
      piVar4 = (int *)realloc(pVVar1->pArray,(long)(int)uVar7 << 2);
    }
    pVVar1->pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00749bee;
    pVVar1->nCap = uVar7;
  }
  if (0 < (int)uVar7) {
    memset(pVVar1->pArray,0xff,(ulong)uVar7 * 4);
  }
  pVVar1->nSize = uVar7;
  pVVar1 = p->vNvars;
  uVar7 = p->pGia->nObjs;
  if (pVVar1->nCap < (int)uVar7) {
    if (pVVar1->pArray == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar7 << 2);
    }
    else {
      piVar4 = (int *)realloc(pVVar1->pArray,(long)(int)uVar7 << 2);
    }
    pVVar1->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_00749bee:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar1->nCap = uVar7;
  }
  if (0 < (int)uVar7) {
    memset(pVVar1->pArray,0,(ulong)uVar7 * 4);
  }
  pVVar1->nSize = uVar7;
  ppLevels = &p->pLevels;
  if (p->pLevels != (int *)0x0) {
    free(p->pLevels);
    *ppLevels = (int *)0x0;
  }
  pGVar2 = p->pGia;
  if (pGVar2->pManTime == (void *)0x0) {
    iVar3 = Gia_ManLutLevel(pGVar2,ppLevels);
    p->DelayMax = iVar3;
  }
  else {
    iVar3 = Gia_ManLutLevelWithBoxes(pGVar2);
    p->DelayMax = iVar3;
    pVVar1 = p->pGia->vLevels;
    piVar4 = pVVar1->pArray;
    pVVar1->nCap = 0;
    pVVar1->nSize = 0;
    pVVar1->pArray = (int *)0x0;
    p->pLevels = piVar4;
    pGVar2 = p->pGia;
    if (pGVar2->vLevels != (Vec_Int_t *)0x0) {
      piVar4 = pGVar2->vLevels->pArray;
      if (piVar4 != (int *)0x0) {
        free(piVar4);
        pGVar2->vLevels->pArray = (int *)0x0;
      }
      if (pGVar2->vLevels != (Vec_Int_t *)0x0) {
        free(pGVar2->vLevels);
        pGVar2->vLevels = (Vec_Int_t *)0x0;
      }
    }
  }
  pGVar2 = p->pGia;
  if (1 < pGVar2->nObjs) {
    pGVar5 = pGVar2->pObjs;
    lVar6 = 1;
    do {
      pGVar5 = pGVar5 + 1;
      uVar7 = (uint)*(ulong *)pGVar5;
      uVar8 = *(ulong *)pGVar5 & 0x1fffffff;
      if (-1 < (int)uVar7 || uVar8 == 0x1fffffff) {
        if (-1 < (int)uVar7 && (int)uVar8 != 0x1fffffff) {
          if (pGVar2->vMapping->nSize <= lVar6) goto LAB_00749bb0;
          if (pGVar2->vMapping->pArray[lVar6] == 0) goto LAB_00749b6f;
        }
        if ((~uVar7 & 0x9fffffff) != 0) {
          if (pGVar2->vMapping->nSize <= lVar6) {
LAB_00749bb0:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (pGVar2->vMapping->pArray[lVar6] == 0) {
            __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsLut(p->pGia, iLut)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                          ,0x86,"int Seg_ManCountIntLevels(Seg_Man_t *, int)");
          }
        }
        if (p->vFirsts->nSize <= lVar6) {
LAB_00749b91:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vFirsts->pArray[lVar6] = iStartVar;
        if (p->vNvars->nSize <= lVar6) goto LAB_00749b91;
        iVar3 = (*ppLevels)[lVar6];
        if (iVar3 < 2) {
          iVar3 = 0;
        }
        p->vNvars->pArray[lVar6] = iVar3;
        iStartVar = iStartVar + iVar3;
      }
LAB_00749b6f:
      lVar6 = lVar6 + 1;
    } while (lVar6 < pGVar2->nObjs);
  }
  return iStartVar;
}

Assistant:

int Seg_ManCountIntLevels( Seg_Man_t * p, int iStartVar )
{
    Gia_Obj_t * pObj;
    int iLut, nVars;
    Vec_IntFill( p->vFirsts, Gia_ManObjNum(p->pGia), -1 );
    Vec_IntFill( p->vNvars,  Gia_ManObjNum(p->pGia), 0 );
    ABC_FREE( p->pLevels );
    if ( p->pGia->pManTime )
    {
        p->DelayMax = Gia_ManLutLevelWithBoxes( p->pGia );
        p->pLevels = Vec_IntReleaseArray( p->pGia->vLevels );
        Vec_IntFreeP( &p->pGia->vLevels );
    }
    else
        p->DelayMax = Gia_ManLutLevel( p->pGia, &p->pLevels );
    Gia_ManForEachObj1( p->pGia, pObj, iLut )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsLut(p->pGia, iLut) )
            continue;
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsLut(p->pGia, iLut) );
        Vec_IntWriteEntry( p->vFirsts, iLut, iStartVar );
        //assert( p->pLevels[iLut] > 0 );
        nVars = p->pLevels[iLut] < 2 ? 0 : p->pLevels[iLut];
        Vec_IntWriteEntry( p->vNvars,  iLut, nVars );
        iStartVar += nVars;
    }
    return iStartVar;
}